

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O3

bool __thiscall Disa::Matrix_Sparse::contains(Matrix_Sparse *this,size_t *i_row,size_t *i_column)

{
  unsigned_long uVar1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator_element iter_element;
  const_iterator_element local_68;
  Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> local_48;
  matrix_type *local_28;
  size_t local_20;
  
  find(&local_68,this,i_row,i_column);
  if (local_68.row_index == *i_row) {
    cVar3 = begin(this);
    local_28 = cVar3.matrix_row.matrix;
    local_20 = cVar3.matrix_row.row_index + *i_row;
    uVar1 = (local_28->row_non_zero).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[local_20 + 1];
    Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
              (&local_48,local_28,&local_20,
               (local_28->column_index).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + uVar1,
               (local_28->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start + uVar1);
    bVar2 = true;
    if (((local_68.matrix == local_48.matrix) && (local_68.row_index == local_48.row_index)) &&
       (local_68.column_index == local_48.column_index)) {
      bVar2 = local_68.value != local_48.value;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Matrix_Sparse::contains(const std::size_t& i_row, const std::size_t& i_column) const {
  const auto iter_element = find(i_row, i_column);
  return iter_element.i_row() == i_row && iter_element != (*(begin() + static_cast<s_size_t>(i_row))).end();
}